

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# narpc_storage_client.cc
# Opt level: O3

Future<int> * __thiscall
NarpcStorageClient::ReadData
          (Future<int> *__return_storage_ptr__,NarpcStorageClient *this,int key,longlong address,
          shared_ptr<crail::ByteBuffer> *buf)

{
  element_type *peVar1;
  int iVar2;
  AsyncTask<int> *pAVar3;
  bool bVar4;
  shared_ptr<NarpcReadResponse> response;
  shared_ptr<NarpcReadRequest> request;
  undefined1 local_89;
  NarpcReadResponse *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  NarpcReadRequest *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  shared_ptr<RpcMessage> local_68;
  shared_ptr<RpcMessage> local_58;
  RpcClient *local_48;
  int local_3c;
  longlong local_38;
  
  peVar1 = (buf->super___shared_ptr<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_88 = (NarpcReadResponse *)CONCAT44(local_88._4_4_,peVar1->limit_ - peVar1->position_);
  local_78 = (NarpcReadRequest *)0x0;
  local_3c = key;
  local_38 = address;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<NarpcReadRequest,std::allocator<NarpcReadRequest>,int&,long_long&,int>
            (&local_70,&local_78,(allocator<NarpcReadRequest> *)&local_48,&local_3c,&local_38,
             (int *)&local_88);
  local_88 = (NarpcReadResponse *)0x0;
  local_48 = &this->rpc_client_;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<NarpcReadResponse,std::allocator<NarpcReadResponse>,RpcClient*,std::shared_ptr<crail::ByteBuffer>&>
            (&local_80,&local_88,(allocator<NarpcReadResponse> *)&local_89,&local_48,buf);
  local_58.super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_78;
  local_58.super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_70._M_pi;
  if (local_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_70._M_pi)->_M_use_count = (local_70._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_70._M_pi)->_M_use_count = (local_70._M_pi)->_M_use_count + 1;
    }
  }
  local_68.super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_88;
  local_68.super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_80._M_pi;
  if (local_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_80._M_pi)->_M_use_count = (local_80._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_80._M_pi)->_M_use_count = (local_80._M_pi)->_M_use_count + 1;
    }
  }
  iVar2 = RpcClient::IssueRequest(&this->rpc_client_,&local_58,&local_68);
  if (local_68.super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  if (local_58.super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<RpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  if (iVar2 < 0) {
    (__return_storage_ptr__->super_AsyncTask<int>)._vptr_AsyncTask = (_func_int **)&PTR_get_00130390
    ;
    (__return_storage_ptr__->task_).super___shared_ptr<AsyncTask<int>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    (__return_storage_ptr__->task_).super___shared_ptr<AsyncTask<int>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    __return_storage_ptr__->is_done_ = true;
    __return_storage_ptr__->result_ = -1;
    goto LAB_001240af;
  }
  pAVar3 = &local_88->super_AsyncTask<int>;
  if (local_88 == (NarpcReadResponse *)0x0) {
    pAVar3 = (AsyncTask<int> *)0x0;
  }
  if (local_80._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (__return_storage_ptr__->super_AsyncTask<int>)._vptr_AsyncTask = (_func_int **)&PTR_get_00130390
    ;
    (__return_storage_ptr__->task_).super___shared_ptr<AsyncTask<int>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = pAVar3;
    (__return_storage_ptr__->task_).super___shared_ptr<AsyncTask<int>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    __return_storage_ptr__->is_done_ = false;
    goto LAB_001240af;
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    (local_80._M_pi)->_M_use_count = (local_80._M_pi)->_M_use_count + 1;
    UNLOCK();
    bVar4 = __libc_single_threaded != '\0';
    (__return_storage_ptr__->super_AsyncTask<int>)._vptr_AsyncTask = (_func_int **)&PTR_get_00130390
    ;
    (__return_storage_ptr__->task_).super___shared_ptr<AsyncTask<int>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = pAVar3;
    (__return_storage_ptr__->task_).super___shared_ptr<AsyncTask<int>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = local_80._M_pi;
    if (bVar4) goto LAB_001240a3;
    LOCK();
    (local_80._M_pi)->_M_use_count = (local_80._M_pi)->_M_use_count + 1;
    UNLOCK();
  }
  else {
    (local_80._M_pi)->_M_use_count = (local_80._M_pi)->_M_use_count + 1;
    (__return_storage_ptr__->super_AsyncTask<int>)._vptr_AsyncTask = (_func_int **)&PTR_get_00130390
    ;
    (__return_storage_ptr__->task_).super___shared_ptr<AsyncTask<int>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = pAVar3;
    (__return_storage_ptr__->task_).super___shared_ptr<AsyncTask<int>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = local_80._M_pi;
LAB_001240a3:
    (local_80._M_pi)->_M_use_count = (local_80._M_pi)->_M_use_count + 1;
  }
  __return_storage_ptr__->is_done_ = false;
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80._M_pi);
LAB_001240af:
  if (local_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80._M_pi);
  }
  if (local_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

Future<int> NarpcStorageClient::ReadData(int key, long long address,
                                         shared_ptr<ByteBuffer> buf) {
  shared_ptr<NarpcReadRequest> request =
      make_shared<NarpcReadRequest>(key, address, buf->remaining());
  shared_ptr<NarpcReadResponse> response =
      make_shared<NarpcReadResponse>(&rpc_client_, buf);

  if (rpc_client_.IssueRequest(request, response) < 0) {
    return Future<int>::Failure(-1);
  }
  return Future<int>(response);
}